

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

string * __thiscall
vkt::sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType coordType,
          Precision precision)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 *puVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  undefined4 in_register_0000000c;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  DataType dataType;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertexParams;
  string vertexTmpl;
  key_type local_100;
  undefined1 local_e0 [8];
  _Base_ptr *local_d8;
  _Base_ptr local_d0;
  _Base_ptr p_Stack_c8;
  _Base_ptr local_c0;
  size_t local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  dataType = (DataType)this;
  pcVar10 = 
  "layout(location = 1) in ${PRECISION} ${DATATYPE} a_coord;\nlayout(location = 0) out ${PRECISION} ${DATATYPE} v_coord;\n"
  ;
  if (dataType == TYPE_LAST) {
    pcVar10 = "";
  }
  local_70[0] = local_60;
  pcVar5 = pcVar10 + 0x75;
  if (dataType == TYPE_LAST) {
    pcVar5 = pcVar10;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,pcVar10,pcVar5,CONCAT44(in_register_0000000c,precision));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0xb18f8d);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar2 = &local_100.field_2;
  puVar8 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100.field_2._8_4_ = (undefined4)plVar3[3];
    local_100.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_100._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar8;
    local_100._M_dataplus._M_p = (pointer)*plVar3;
  }
  pcVar10 = "\tv_coord = a_coord;\n";
  if (dataType == TYPE_LAST) {
    pcVar10 = "";
  }
  local_100._M_string_length = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar5 = pcVar10 + 0x14;
  if (dataType == TYPE_LAST) {
    pcVar5 = pcVar10;
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar10,pcVar5);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    uVar11 = local_100.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_a8 + local_100._M_string_length) {
    uVar12 = 0xf;
    if (local_b0 != local_a0) {
      uVar12 = local_a0[0];
    }
    if (local_a8 + local_100._M_string_length <= uVar12) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      goto LAB_0057e44e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_b0);
LAB_0057e44e:
  local_e0 = (undefined1  [8])&local_d0;
  pp_Var1 = (_Base_ptr *)(puVar4 + 2);
  if ((_Base_ptr *)*puVar4 == pp_Var1) {
    local_d0 = *pp_Var1;
    p_Stack_c8 = (_Base_ptr)puVar4[3];
  }
  else {
    local_d0 = *pp_Var1;
    local_e0 = (undefined1  [8])*puVar4;
  }
  local_d8 = (_Base_ptr *)puVar4[1];
  *puVar4 = pp_Var1;
  puVar4[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_e0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90.field_2._8_8_ = plVar3[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_e0 != (undefined1  [8])&local_d0) {
    operator_delete((void *)local_e0,(ulong)((long)&local_d0->_M_color + 1));
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Stack_c8 = (_Base_ptr)&local_d8;
  local_d8 = (_Base_ptr *)((ulong)local_d8 & 0xffffffff00000000);
  local_d0 = (_Base_ptr)0x0;
  local_b8 = 0;
  local_c0 = p_Stack_c8;
  if (dataType != TYPE_LAST) {
    pcVar5 = glu::getPrecisionName(coordType);
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"PRECISION","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,&local_100);
    pcVar10 = (char *)pmVar6->_M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar10,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = glu::getDataTypeName(dataType);
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"DATATYPE","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,&local_100);
    pcVar10 = (char *)pmVar6->_M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar10,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_100,&local_90);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,(StringTemplate *)&local_100,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_e0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string genVertexSource (glu::DataType coordType, glu::Precision precision)
{
	DE_ASSERT(coordType == glu::TYPE_LAST || glu::isDataTypeFloatOrVec(coordType));

	const std::string vertexTmpl =
		"#version 450\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		+ string(coordType != glu::TYPE_LAST ? "layout(location = 1) in ${PRECISION} ${DATATYPE} a_coord;\n"
											   "layout(location = 0) out ${PRECISION} ${DATATYPE} v_coord;\n" : "") +
		"out gl_PerVertex {\n"
		"	vec4 gl_Position;\n"
		"};\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		+ string(coordType != glu::TYPE_LAST ? "	v_coord = a_coord;\n" : "") +
		"}\n";

	map<string, string> vertexParams;

	if (coordType != glu::TYPE_LAST)
	{
		vertexParams["PRECISION"]	= glu::getPrecisionName(precision);
		vertexParams["DATATYPE"]	= glu::getDataTypeName(coordType);
	}

	return tcu::StringTemplate(vertexTmpl).specialize(vertexParams);
}